

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O3

bool __thiscall
ON_PolyEdgeHistoryValue::ReadHelper(ON_PolyEdgeHistoryValue *this,ON_BinaryArchive *archive)

{
  ON_ClassArray<ON_PolyEdgeHistory> *this_00;
  bool bVar1;
  bool bVar2;
  ON_PolyEdgeHistory *this_01;
  int iVar3;
  byte bVar4;
  int count;
  int minor_version;
  int major_version;
  uint local_34 [3];
  
  this_00 = &this->m_value;
  bVar2 = false;
  ON_ClassArray<ON_PolyEdgeHistory>::SetCapacity(this_00,0);
  local_34[2] = 0;
  local_34[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                    (archive,0x40008000,(int *)(local_34 + 2),(int *)(local_34 + 1));
  if (bVar1) {
    local_34[0] = 0;
    bVar1 = ON_BinaryArchive::ReadInt(archive,(ON__INT32 *)local_34);
    if (bVar1) {
      if ((uint)(this->m_value).m_capacity < local_34[0]) {
        ON_ClassArray<ON_PolyEdgeHistory>::SetCapacity(this_00,(long)(int)local_34[0]);
      }
      bVar4 = 1;
      if (0 < (int)local_34[0]) {
        iVar3 = 0;
        do {
          this_01 = ON_ClassArray<ON_PolyEdgeHistory>::AppendNew(this_00);
          bVar1 = ON_PolyEdgeHistory::Read(this_01,archive);
          if (!bVar1) {
            bVar4 = 0;
            ON_ClassArray<ON_PolyEdgeHistory>::SetCapacity(this_00,0);
            break;
          }
          iVar3 = iVar3 + 1;
        } while (iVar3 < (int)local_34[0]);
      }
    }
    else {
      bVar4 = 0;
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
    bVar2 = (bool)(bVar2 & bVar4);
  }
  return bVar2;
}

Assistant:

bool ON_PolyEdgeHistoryValue::ReadHelper(ON_BinaryArchive& archive )
{
  m_value.Destroy();

  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;

  for(;;)
  {
    int count = 0;
    rc = archive.ReadInt(&count);
    if (!rc) break;
    m_value.Reserve(count);
    
    for( int i = 0; i < count && rc; i++ )
    {
      if ( !m_value.AppendNew().Read(archive) )
      {
        m_value.Destroy();
        rc = false;
        break;
      }
    }
    if (!rc) break;

    break;
  }

  if ( !archive.EndRead3dmChunk() )
    rc = false;
  return rc;
}